

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void init_qp(int16_t *round_ptr,int16_t *quant_ptr,int16_t *dequant_ptr,int log_scale,__m256i *qp)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int in_ECX;
  longlong *in_RDX;
  longlong *in_RSI;
  __m128i *in_RDI;
  __m256i *in_R8;
  __m128i dequant;
  __m128i quant;
  __m128i round_scale;
  __m128i round;
  longlong local_d8;
  longlong lStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  __m128i local_a8;
  __m256i *local_90;
  char local_84;
  ushort local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  longlong local_38;
  longlong lStack_30;
  undefined1 local_28 [16];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  local_a8 = *in_RDI;
  if (in_ECX != 0) {
    local_84 = (char)in_ECX;
    uVar2 = 1 << (0xfU - local_84 & 0x1f);
    local_4a = (ushort)uVar2;
    auVar1 = vpinsrw_avx(ZEXT216(local_4a),uVar2 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,uVar2 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,uVar2 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,uVar2 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,uVar2 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,uVar2 & 0xffff,6);
    local_28 = vpinsrw_avx(auVar1,uVar2 & 0xffff,7);
    local_b8 = local_28._0_8_;
    uStack_b0 = local_28._8_8_;
    local_48 = local_28._0_8_;
    uStack_40 = local_28._8_8_;
    local_a8 = (__m128i)vpmulhrsw_avx((undefined1  [16])*in_RDI,local_28);
    local_38 = (*in_RDI)[0];
    lStack_30 = (*in_RDI)[1];
    local_10 = local_4a;
    local_e = local_4a;
    local_c = local_4a;
    local_a = local_4a;
    local_8 = local_4a;
    local_6 = local_4a;
    local_4 = local_4a;
    local_2 = local_4a;
  }
  local_c8 = *in_RSI;
  lStack_c0 = in_RSI[1];
  local_d8 = *in_RDX;
  lStack_d0 = in_RDX[1];
  local_90 = in_R8;
  init_one_qp(&local_a8,in_R8);
  init_one_qp((__m128i *)&local_c8,local_90 + 1);
  init_one_qp((__m128i *)&local_d8,local_90 + 2);
  return;
}

Assistant:

static inline void init_qp(const int16_t *round_ptr, const int16_t *quant_ptr,
                           const int16_t *dequant_ptr, int log_scale,
                           __m256i *thr, __m256i *qp) {
  __m128i round = _mm_loadu_si128((const __m128i *)round_ptr);
  const __m128i quant = _mm_loadu_si128((const __m128i *)quant_ptr);
  const __m128i dequant = _mm_loadu_si128((const __m128i *)dequant_ptr);

  if (log_scale > 0) {
    const __m128i rnd = _mm_set1_epi16((int16_t)1 << (log_scale - 1));
    round = _mm_add_epi16(round, rnd);
    round = _mm_srai_epi16(round, log_scale);
  }

  init_one_qp(&round, &qp[0]);
  init_one_qp(&quant, &qp[1]);

  if (log_scale == 1) {
    qp[1] = _mm256_slli_epi16(qp[1], log_scale);
  }

  init_one_qp(&dequant, &qp[2]);
  *thr = _mm256_srai_epi16(qp[2], 1 + log_scale);
  // Subtracting 1 here eliminates a _mm256_cmpeq_epi16() instruction when
  // calculating the zbin mask.
  *thr = _mm256_sub_epi16(*thr, _mm256_set1_epi16(1));
}